

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O1

void changeLibPathsOnFile(string *file_to_fix)

{
  char *__s;
  iterator iVar1;
  size_t sVar2;
  mapped_type *__x;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  vector<Dependency,_std::allocator<Dependency>_> local_30;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::find(&deps_collected_abi_cxx11_._M_t,file_to_fix);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &deps_collected_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    collectDependencies(file_to_fix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  * Fixing dependencies on ",0x1b);
  __s = (file_to_fix->_M_dataplus)._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x128230);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
        ::operator[](&deps_per_file_abi_cxx11_,file_to_fix);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector(&local_30,__x);
  uVar3 = (int)((long)local_30.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_30.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x11111111;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    lVar5 = 0;
    do {
      Dependency::fixFileThatDependsOnMe
                ((Dependency *)
                 ((long)&((local_30.super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                           _M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus._M_p +
                 lVar5),file_to_fix);
      lVar5 = lVar5 + 0x78;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector(&local_30);
  return;
}

Assistant:

void changeLibPathsOnFile(std::string file_to_fix)
{
    if (deps_collected.find(file_to_fix) == deps_collected.end())
    {
        std::cout << "    ";
        collectDependencies(file_to_fix);
        std::cout << "\n";
    }
    std::cout << "  * Fixing dependencies on " << file_to_fix.c_str() << std::endl;
    
    std::vector<Dependency> deps_in_file = deps_per_file[file_to_fix];
    const int dep_amount = deps_in_file.size();
    for(int n=0; n<dep_amount; n++)
    {
        deps_in_file[n].fixFileThatDependsOnMe(file_to_fix);
    }
}